

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-util-ossl.cpp
# Opt level: O0

int crypto_import_key_pair
              (CK_SESSION_HANDLE hSession,char *filePath,char *filePIN,char *label,char *objID,
              size_t objIDLen,int noPublicKey)

{
  int iVar1;
  EVP_PKEY *pkey_00;
  char *in_R9;
  int result;
  EVP_PKEY *eddsa;
  EC_KEY *ecdsa;
  DSA *dsa;
  RSA *rsa;
  EVP_PKEY *pkey;
  EC_KEY *in_stack_00000210;
  int in_stack_0000021c;
  size_t in_stack_00000220;
  char *in_stack_00000228;
  char *in_stack_00000230;
  CK_SESSION_HANDLE in_stack_00000238;
  DSA *in_stack_00000270;
  int in_stack_0000027c;
  size_t in_stack_00000280;
  char *in_stack_00000288;
  char *in_stack_00000290;
  CK_SESSION_HANDLE in_stack_00000298;
  RSA *in_stack_000002a0;
  int in_stack_000002ac;
  size_t in_stack_000002b0;
  char *in_stack_000002b8;
  char *in_stack_000002c0;
  CK_SESSION_HANDLE in_stack_000002c8;
  int local_64;
  EVP_PKEY *local_60;
  EC_KEY *local_58;
  DSA *local_50;
  RSA *local_48;
  char *in_stack_ffffffffffffffc0;
  int local_4;
  
  pkey_00 = (EVP_PKEY *)crypto_read_file(in_R9,in_stack_ffffffffffffffc0);
  if (pkey_00 == (EVP_PKEY *)0x0) {
    local_4 = 1;
  }
  else {
    local_48 = (RSA *)0x0;
    local_50 = (DSA *)0x0;
    local_58 = (EC_KEY *)0x0;
    local_60 = (EVP_PKEY *)0x0;
    iVar1 = EVP_PKEY_get_id(pkey_00);
    iVar1 = EVP_PKEY_type(iVar1);
    if (iVar1 == 6) {
      local_48 = EVP_PKEY_get1_RSA(pkey_00);
    }
    else if (iVar1 == 0x74) {
      local_50 = EVP_PKEY_get1_DSA(pkey_00);
    }
    else if (iVar1 == 0x198) {
      local_58 = EVP_PKEY_get1_EC_KEY(pkey_00);
    }
    else {
      if ((1 < iVar1 - 0x40aU) && (1 < iVar1 - 0x43fU)) {
        fprintf(_stderr,"ERROR: Cannot handle this algorithm.\n");
        EVP_PKEY_free(pkey_00);
        return 1;
      }
      local_60 = pkey_00;
      EVP_PKEY_up_ref(pkey_00);
      pkey_00 = local_60;
    }
    EVP_PKEY_free(pkey_00);
    if (local_48 == (RSA *)0x0) {
      if (local_50 == (DSA *)0x0) {
        if (local_58 == (EC_KEY *)0x0) {
          if (local_60 == (EVP_PKEY *)0x0) {
            fprintf(_stderr,"ERROR: Could not get the key material.\n");
            local_64 = 1;
          }
          else {
            local_64 = crypto_save_eddsa(in_stack_00000238,in_stack_00000230,in_stack_00000228,
                                         in_stack_00000220,in_stack_0000021c,
                                         (EVP_PKEY *)in_stack_00000210);
            EVP_PKEY_free(local_60);
          }
        }
        else {
          local_64 = crypto_save_ecdsa(in_stack_00000238,in_stack_00000230,in_stack_00000228,
                                       in_stack_00000220,in_stack_0000021c,in_stack_00000210);
          EC_KEY_free(local_58);
        }
      }
      else {
        local_64 = crypto_save_dsa(in_stack_00000298,in_stack_00000290,in_stack_00000288,
                                   in_stack_00000280,in_stack_0000027c,in_stack_00000270);
        DSA_free(local_50);
      }
    }
    else {
      local_64 = crypto_save_rsa(in_stack_000002c8,in_stack_000002c0,in_stack_000002b8,
                                 in_stack_000002b0,in_stack_000002ac,in_stack_000002a0);
      RSA_free(local_48);
    }
    local_4 = local_64;
  }
  return local_4;
}

Assistant:

int crypto_import_key_pair
(
	CK_SESSION_HANDLE hSession,
	char* filePath,
	char* filePIN,
	char* label,
	char* objID,
	size_t objIDLen,
	int noPublicKey
)
{
	EVP_PKEY* pkey = crypto_read_file(filePath, filePIN);
	if (pkey == NULL)
	{
		return 1;
	}

	RSA* rsa = NULL;
	DSA* dsa = NULL;
#ifdef WITH_ECC
	EC_KEY* ecdsa = NULL;
#endif
#ifdef WITH_EDDSA
	EVP_PKEY* eddsa = NULL;
#endif

	switch (EVP_PKEY_type(EVP_PKEY_id(pkey)))
	{
		case EVP_PKEY_RSA:
			rsa = EVP_PKEY_get1_RSA(pkey);
			break;
		case EVP_PKEY_DSA:
			dsa = EVP_PKEY_get1_DSA(pkey);
			break;
#ifdef WITH_ECC
		case EVP_PKEY_EC:
			ecdsa = EVP_PKEY_get1_EC_KEY(pkey);
			break;
#endif
#ifdef WITH_EDDSA
		case NID_X25519:
		case NID_ED25519:
		case NID_X448:
		case NID_ED448:
			EVP_PKEY_up_ref(pkey);
			eddsa = pkey;
			break;
#endif
		default:
			fprintf(stderr, "ERROR: Cannot handle this algorithm.\n");
			EVP_PKEY_free(pkey);
			return 1;
			break;
	}
	EVP_PKEY_free(pkey);

	int result = 0;

	if (rsa)
	{
		result = crypto_save_rsa(hSession, label, objID, objIDLen, noPublicKey, rsa);
		RSA_free(rsa);
	}
	else if (dsa)
	{
		result = crypto_save_dsa(hSession, label, objID, objIDLen, noPublicKey, dsa);
		DSA_free(dsa);
	}
#ifdef WITH_ECC
	else if (ecdsa)
	{
		result = crypto_save_ecdsa(hSession, label, objID, objIDLen, noPublicKey, ecdsa);
		EC_KEY_free(ecdsa);
	}
#endif
#ifdef WITH_EDDSA
	else if (eddsa)
	{
		result = crypto_save_eddsa(hSession, label, objID, objIDLen, noPublicKey, eddsa);
		EVP_PKEY_free(eddsa);
	}
#endif
	else
	{
		fprintf(stderr, "ERROR: Could not get the key material.\n");
		result = 1;
	}